

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall
soul::StructuralParser::checkAndCreateArrayElementRef
          (StructuralParser *this,Context *c,Expression *lhs,pool_ptr<soul::AST::Expression> *start,
          pool_ptr<soul::AST::Expression> *end)

{
  ExpressionKind EVar1;
  bool bVar2;
  Expression *pEVar3;
  Constant *pCVar4;
  ulong uVar5;
  ulong uVar6;
  ArrayElementRef *pAVar7;
  pool_ptr<soul::AST::Constant> startConst;
  pool_ptr<soul::AST::Constant> endConst;
  pool_ptr<soul::AST::Constant> local_1b0;
  pool_ptr<soul::AST::Constant> local_1a8;
  pool_ptr<soul::AST::Expression> local_1a0;
  pool_ptr<soul::AST::Expression> local_198;
  pool_ptr<soul::AST::Expression> local_190;
  pool_ptr<soul::AST::Expression> local_188;
  CompileMessage local_180;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  EVar1 = lhs->kind;
  if ((((EVar1 & ~unknown) != value) && (EVar1 != endpoint)) && (EVar1 != unknown)) {
    Errors::expectedValueOrEndpoint<>();
    AST::Context::throwError(&(lhs->super_Statement).super_ASTObject.context,&local_68,false);
  }
  if (start->object != (Expression *)0x0) {
    local_188.object = start->object;
    bVar2 = AST::isPossiblyValue(&local_188);
    if (!bVar2) {
      pEVar3 = pool_ptr<soul::AST::Expression>::operator->(start);
      Errors::expectedValue<>();
      AST::Context::throwError(&(pEVar3->super_Statement).super_ASTObject.context,&local_a0,false);
    }
  }
  if (end->object != (Expression *)0x0) {
    local_190.object = end->object;
    bVar2 = AST::isPossiblyValue(&local_190);
    if (!bVar2) {
      pEVar3 = pool_ptr<soul::AST::Expression>::operator->(end);
      Errors::expectedValue<>();
      AST::Context::throwError(&(pEVar3->super_Statement).super_ASTObject.context,&local_d8,false);
    }
  }
  local_198 = (pool_ptr<soul::AST::Expression>)start->object;
  bVar2 = AST::isResolvedAsConstant(&local_198);
  if (bVar2) {
    local_1a0 = (pool_ptr<soul::AST::Expression>)end->object;
    bVar2 = AST::isResolvedAsConstant(&local_1a0);
    if (bVar2) {
      pEVar3 = pool_ptr<soul::AST::Expression>::operator->(start);
      (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_1b0,pEVar3);
      pEVar3 = pool_ptr<soul::AST::Expression>::operator->(end);
      (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_1a8,pEVar3);
      pCVar4 = pool_ptr<soul::AST::Constant>::operator->(&local_1b0);
      if (1 < (pCVar4->value).type.primitiveType.type - int32) {
        pEVar3 = pool_ptr<soul::AST::Expression>::operator->(start);
        Errors::expectedInteger<>();
        AST::Context::throwError
                  (&(pEVar3->super_Statement).super_ASTObject.context,&local_110,false);
      }
      pCVar4 = pool_ptr<soul::AST::Constant>::operator->(&local_1a8);
      if (1 < (pCVar4->value).type.primitiveType.type - int32) {
        pEVar3 = pool_ptr<soul::AST::Expression>::operator->(end);
        Errors::expectedInteger<>();
        AST::Context::throwError
                  (&(pEVar3->super_Statement).super_ASTObject.context,&local_148,false);
      }
      pCVar4 = pool_ptr<soul::AST::Constant>::operator->(&local_1b0);
      uVar5 = soul::Value::getAsInt64(&pCVar4->value);
      pCVar4 = pool_ptr<soul::AST::Constant>::operator->(&local_1a8);
      uVar6 = soul::Value::getAsInt64(&pCVar4->value);
      if (((long)uVar6 <= (long)uVar5 && -1 < (long)(uVar6 | uVar5)) ||
         ((long)(uVar6 & uVar5) < 0 && (long)uVar6 <= (long)uVar5)) {
        pEVar3 = pool_ptr<soul::AST::Expression>::operator->(end);
        Errors::illegalSliceSize<>();
        AST::Context::throwError
                  (&(pEVar3->super_Statement).super_ASTObject.context,&local_180,false);
      }
    }
  }
  local_1b0.object._0_1_ = 1;
  pAVar7 = allocate<soul::AST::ArrayElementRef,soul::AST::Context_const&,soul::AST::Expression&,soul::pool_ptr<soul::AST::Expression>&,soul::pool_ptr<soul::AST::Expression>&,bool>
                     (this,c,lhs,start,end,(bool *)&local_1b0);
  return &pAVar7->super_Expression;
}

Assistant:

AST::Expression& checkAndCreateArrayElementRef (const AST::Context& c, AST::Expression& lhs,
                                                    pool_ptr<AST::Expression> start,
                                                    pool_ptr<AST::Expression> end)
    {
        if (! (AST::isPossiblyValue (lhs) || AST::isPossiblyEndpoint (lhs)))
            lhs.context.throwError (Errors::expectedValueOrEndpoint());

        if (start != nullptr && ! AST::isPossiblyValue (start))   start->context.throwError (Errors::expectedValue());
        if (end != nullptr   && ! AST::isPossiblyValue (end))     end->context.throwError (Errors::expectedValue());

        if (AST::isResolvedAsConstant (start) && AST::isResolvedAsConstant (end))
        {
            auto startConst = start->getAsConstant();
            auto endConst = end->getAsConstant();

            if (! startConst->value.getType().isInteger())  start->context.throwError (Errors::expectedInteger());
            if (! endConst->value.getType().isInteger())    end->context.throwError (Errors::expectedInteger());

            auto s = startConst->value.getAsInt64();
            auto e = endConst->value.getAsInt64();

            if ((s >= 0 && e >= 0 && s >= e) || (s < 0 && e < 0 && s >= e))
                end->context.throwError (Errors::illegalSliceSize());
        }

        return allocate<AST::ArrayElementRef> (c, lhs, start, end, true);
    }